

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

QAction * __thiscall QMenu::exec(QMenu *this,QPoint *p,QAction *action)

{
  long lVar1;
  QMenuPrivate *this_00;
  QAction *pQVar2;
  PositionFunction *in_RDX;
  QAction *in_RSI;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  QMenuPrivate *d;
  QMenuPrivate *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QMenu *)0x6497bf);
  std::function<QPoint_(const_QSize_&)>::function((function<QPoint_(const_QSize_&)> *)this_00);
  pQVar2 = QMenuPrivate::exec(in_stack_ffffffffffffffd8,in_RDI,in_RSI,in_RDX);
  std::function<QPoint_(const_QSize_&)>::~function((function<QPoint_(const_QSize_&)> *)0x649819);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QAction *QMenu::exec(const QPoint &p, QAction *action)
{
    Q_D(QMenu);
    return d->exec(p, action);
}